

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

void PairSearchHelper(ON_RTreeBranch *a_branchA,ON_RTreeNode *a_nodeB,
                     ON_RTreePairSearchResult *a_result)

{
  bool bVar1;
  ON_RTreeBranch *pOVar2;
  ON_2dex *pOVar3;
  ON_2dex *r;
  ON_RTreeBranch *branchBmax;
  ON_RTreeBranch *branchB;
  ON_RTreePairSearchResult *a_result_local;
  ON_RTreeNode *a_nodeB_local;
  ON_RTreeBranch *a_branchA_local;
  
  branchBmax = a_nodeB->m_branch;
  pOVar2 = branchBmax + a_nodeB->m_count;
  for (; branchBmax < pOVar2; branchBmax = branchBmax + 1) {
    bVar1 = PairSearchOverlapHelper(&a_branchA->m_rect,&branchBmax->m_rect,a_result->m_tolerance);
    if (bVar1) {
      if (a_nodeB->m_level < 1) {
        pOVar3 = ON_SimpleArray<ON_2dex>::AppendNew(a_result->m_result);
        pOVar3->i = (int)(a_branchA->field_1).m_id;
        pOVar3->j = (int)(branchBmax->field_1).m_id;
      }
      else {
        PairSearchHelper(a_branchA,(branchBmax->field_1).m_child,a_result);
      }
    }
  }
  return;
}

Assistant:

static void PairSearchHelper( const ON_RTreeBranch* a_branchA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchResult* a_result )
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchB, *branchBmax;

  branchB = a_nodeB->m_branch;
  branchBmax = branchB + a_nodeB->m_count;
  while(branchB < branchBmax)
  {
    if ( PairSearchOverlapHelper( &a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance ) )
    {
      if ( a_nodeB->m_level > 0 )
      {
        PairSearchHelper(a_branchA,branchB->m_child,a_result);
      }
      else
      {
        ON_2dex& r = a_result->m_result->AppendNew();
        r.i = (int)a_branchA->m_id;
        r.j = (int)branchB->m_id;
      }
    }
    branchB++;
  }
}